

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

BlobProto * __thiscall caffe::BlobProto::New(BlobProto *this,Arena *arena)

{
  BlobProto *this_00;
  
  this_00 = (BlobProto *)operator_new(0x90);
  BlobProto(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::BlobProto>(arena,this_00);
  }
  return this_00;
}

Assistant:

BlobProto* BlobProto::New(::google::protobuf::Arena* arena) const {
  BlobProto* n = new BlobProto;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}